

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4CopyPalCommand::Execute
          (DrawColumnRt4CopyPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  uint8_t *puVar6;
  
  iVar3 = (this->super_PalRtCommand).yl;
  uVar1 = DrawerThread::count_for_thread(thread,iVar3,((this->super_PalRtCommand).yh - iVar3) + 1);
  if (0 < (int)uVar1) {
    iVar3 = (this->super_PalRtCommand).yl;
    iVar2 = DrawerThread::skipped_by_thread(thread,iVar3);
    puVar6 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar2 + iVar3];
    puVar4 = thread->dc_temp;
    iVar3 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    puVar4 = puVar4 + (iVar3 << 2);
    iVar3 = thread->num_cores * (this->super_PalRtCommand)._pitch >> 2;
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)puVar6 = *(undefined4 *)puVar4;
      puVar4 = puVar4 + 4;
      puVar6 = puVar6 + (long)iVar3 * 4;
    }
    if (uVar1 != 1) {
      lVar5 = 0;
      do {
        *(undefined4 *)puVar6 = *(undefined4 *)(puVar4 + lVar5 * 8);
        *(undefined4 *)(puVar6 + (long)iVar3 * 4) = *(undefined4 *)(puVar4 + lVar5 * 8 + 4);
        puVar6 = puVar6 + (long)(iVar3 * 2) * 4;
        lVar5 = lVar5 + 1;
      } while (uVar1 >> 1 != (uint)lVar5);
    }
  }
  return;
}

Assistant:

void DrawColumnRt4CopyPalCommand::Execute(DrawerThread *thread)
	{
		int *source;
		int *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = (int *)(ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg);
		source = (int *)(&thread->dc_temp[thread->temp_line_for_thread(yl)*4]);
		pitch = _pitch*thread->num_cores/sizeof(int);
	
		if (count & 1) {
			*dest = *source;
			source += 4/sizeof(int);
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4/sizeof(int)];
			source += 8/sizeof(int);
			dest += pitch*2;
		} while (--count);
	}